

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall Printer::Print(Printer *this,ostream *c,char *data)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  float b;
  int a;
  int i;
  char strSpace [50];
  char local_58 [8];
  char str [53];
  char *data_local;
  ostream *c_local;
  Printer *this_local;
  
  if (data != (char *)0x0) {
    this->iCount = this->iCount + 1;
    unique0x100004ba = data;
    for (b = 0.0; (int)b < this->attrCount; b = (float)((int)b + 1)) {
      if (this->attributes[(int)b].attrType == STRING) {
        memset(local_58,0,0x35);
        if (this->attributes[(int)b].attrLength < 0x36) {
          strncpy(local_58,stack0xffffffffffffffe0 + this->attributes[(int)b].offset,
                  (long)this->attributes[(int)b].attrLength);
          std::operator<<(c,local_58);
          iVar1 = this->attributes[(int)b].attrLength;
          sVar3 = strlen(this->psHeader[(int)b]);
          if (iVar1 < (int)sVar3) {
            sVar3 = strlen(this->psHeader[(int)b]);
            sVar4 = strlen(local_58);
            Spaces((int)sVar3,(int)sVar4);
          }
          else {
            iVar1 = this->attributes[(int)b].attrLength;
            sVar3 = strlen(local_58);
            Spaces(iVar1,(int)sVar3);
          }
        }
        else {
          strncpy(local_58,stack0xffffffffffffffe0 + this->attributes[(int)b].offset,0x34);
          str[0x2a] = '.';
          str[0x2b] = '.';
          std::operator<<(c,local_58);
          sVar3 = strlen(local_58);
          Spaces(0x35,(int)sVar3);
        }
      }
      if (this->attributes[(int)b].attrType == INT) {
        uVar2 = *(uint *)(stack0xffffffffffffffe0 + this->attributes[(int)b].offset);
        sprintf((char *)&a,"%d",(ulong)uVar2);
        std::ostream::operator<<(c,uVar2);
        sVar3 = strlen(this->psHeader[(int)b]);
        if (sVar3 < 0xc) {
          sVar3 = strlen((char *)&a);
          Spaces(0xc,(int)sVar3);
        }
        else {
          sVar3 = strlen(this->psHeader[(int)b]);
          sVar4 = strlen((char *)&a);
          Spaces((int)sVar3,(int)sVar4);
        }
      }
      if (this->attributes[(int)b].attrType == FLOAT) {
        sprintf((char *)&a,"%f",
                (double)*(float *)(stack0xffffffffffffffe0 + this->attributes[(int)b].offset));
        std::operator<<(c,(char *)&a);
        sVar3 = strlen(this->psHeader[(int)b]);
        if (sVar3 < 0xc) {
          sVar3 = strlen((char *)&a);
          Spaces(0xc,(int)sVar3);
        }
        else {
          sVar3 = strlen(this->psHeader[(int)b]);
          sVar4 = strlen((char *)&a);
          Spaces((int)sVar3,(int)sVar4);
        }
      }
    }
    std::operator<<(c,"\n");
  }
  return;
}

Assistant:

void Printer::Print(ostream &c, const char * const data)
{
    char str[MAXPRINTSTRING], strSpace[50];
    int i, a;
    float b;

    if (data == NULL)
        return;

    // Increment the number of tuples printed
    iCount++;

    for (i = 0; i<attrCount; i++) {
        if (attributes[i].attrType == STRING) {
            // We will only print out the first MAXNAME+10 characters of
            // the string value.
            memset(str,0,MAXPRINTSTRING);

            if (attributes[i].attrLength>MAXPRINTSTRING) {
                strncpy(str, data+attributes[i].offset, MAXPRINTSTRING-1);
                str[MAXPRINTSTRING-3] ='.';
                str[MAXPRINTSTRING-2] ='.';
                c << str;
                Spaces(MAXPRINTSTRING, strlen(str));
            } else {
                strncpy(str, data+attributes[i].offset, attributes[i].attrLength);
                c << str;
                if (attributes[i].attrLength < (int) strlen(psHeader[i]))
                    Spaces(strlen(psHeader[i]), strlen(str));
                else
                    Spaces(attributes[i].attrLength, strlen(str));
            }
        }
        if (attributes[i].attrType == INT) {
            memcpy (&a, (data+attributes[i].offset), sizeof(int));
            sprintf(strSpace, "%d",a);
            c << a;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
        if (attributes[i].attrType == FLOAT) {
            memcpy (&b, (data+attributes[i].offset), sizeof(float));
            sprintf(strSpace, "%f",b);
            c << strSpace;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
    }
    c << "\n";
}